

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O3

bool __thiscall
vkt::shaderexecutor::anon_unknown_0::RoundEvenCaseInstance::compare
          (RoundEvenCaseInstance *this,void **inputs,void **outputs)

{
  float fVar1;
  pointer pSVar2;
  void *pvVar3;
  void *pvVar4;
  deUint32 aBits;
  uint uVar5;
  int iVar6;
  int iVar7;
  ostream *poVar8;
  uint uVar9;
  int iVar10;
  ostringstream *poVar11;
  float fVar12;
  ulong uVar13;
  deUint32 bBits;
  float fVar14;
  float fVar15;
  float fVar16;
  float __x;
  Hex<8UL> local_40;
  HexFloat local_34;
  
  pSVar2 = (this->super_CommonFunctionTestInstance).m_spec.inputs.
           super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar9 = *(uint *)((long)&(pSVar2->varType).m_data + 4);
  uVar5 = glu::getDataTypeScalarSize((pSVar2->varType).m_data.basic.type);
  if (uVar9 - 1 < 2) {
    if ((int)uVar5 < 1) {
      return true;
    }
    pvVar3 = *inputs;
    pvVar4 = *outputs;
    uVar13 = 0;
    do {
      fVar12 = *(float *)((long)pvVar3 + uVar13 * 4);
      fVar15 = *(float *)((long)pvVar4 + uVar13 * 4);
      fVar14 = floorf(fVar12);
      fVar14 = fVar12 - fVar14;
      iVar6 = (int)(fVar12 - fVar14);
      if (fVar14 <= 0.5) {
        iVar6 = iVar6 + (uint)((byte)iVar6 & fVar14 == 0.5);
      }
      else {
        iVar6 = iVar6 + 1;
      }
      fVar14 = (float)iVar6;
      if (uVar9 == 2) {
LAB_00840009:
        fVar12 = (float)((int)fVar14 - (int)fVar15);
        if ((uint)fVar14 < (uint)fVar15) {
          fVar12 = (float)-((int)fVar14 - (int)fVar15);
        }
      }
      else if ((fVar15 != 0.0) || (NAN(fVar15))) {
        if (iVar6 != 0) goto LAB_00840009;
        fVar12 = ABS(fVar15);
      }
      else {
        fVar12 = ABS(fVar14);
      }
      if (fVar12 != 0.0) {
        poVar11 = &(this->super_CommonFunctionTestInstance).m_failMsg;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar11,"Expected [",10);
        poVar8 = (ostream *)std::ostream::operator<<(poVar11,(int)uVar13);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] = ",4);
        local_34.value = fVar14;
        poVar8 = anon_unknown_0::operator<<(poVar8,&local_34);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,", got ULP diff ",0xf);
LAB_00840315:
        local_40.value._4_4_ = 0;
        local_40.value._0_4_ = fVar12;
        tcu::Format::Hex<8UL>::toStream(&local_40,poVar8);
        return false;
      }
      uVar13 = uVar13 + 1;
    } while (uVar5 != uVar13);
  }
  else {
    uVar9 = -1 << (0x17 - (&DAT_00b5b32c)[(ulong)uVar9 * 4] & 0x1f);
    if ((int)uVar5 < 1) {
      return true;
    }
    fVar12 = (float)~uVar9;
    fVar15 = (float)(uVar9 & 0x7fffff ^ 0x3fffffff) + -1.0;
    pvVar3 = *inputs;
    pvVar4 = *outputs;
    uVar13 = 0;
    do {
      fVar14 = *(float *)((long)pvVar3 + uVar13 * 4);
      fVar1 = *(float *)((long)pvVar4 + uVar13 * 4);
      __x = fVar14 - fVar15;
      fVar16 = floorf(__x);
      fVar16 = __x - fVar16;
      iVar6 = (int)(__x - fVar16);
      if (fVar16 <= 0.5) {
        iVar6 = iVar6 + (uint)((byte)iVar6 & fVar16 == 0.5);
      }
      else {
        iVar6 = iVar6 + 1;
      }
      fVar14 = fVar14 + fVar15;
      fVar16 = floorf(fVar14);
      fVar16 = fVar14 - fVar16;
      iVar7 = (int)(fVar14 - fVar16);
      if (fVar16 <= 0.5) {
        iVar7 = iVar7 + (uint)((byte)iVar7 & fVar16 == 0.5);
      }
      else {
        iVar7 = iVar7 + 1;
      }
      iVar6 = (int)(float)iVar6;
      iVar7 = (int)(float)iVar7;
      if (iVar7 < iVar6) {
LAB_008401fe:
        poVar11 = &(this->super_CommonFunctionTestInstance).m_failMsg;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar11,"Expected [",10);
        poVar8 = (ostream *)std::ostream::operator<<(poVar11,(int)uVar13);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] = [",5);
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] with ULP threshold ",0x15);
        goto LAB_00840315;
      }
      iVar10 = iVar6;
      while( true ) {
        fVar14 = (float)iVar10;
        if ((fVar1 != 0.0) || (NAN(fVar1))) {
          fVar16 = ABS(fVar1);
          if (iVar10 != 0) {
            fVar16 = (float)((int)fVar14 - (int)fVar1);
            if ((uint)fVar14 < (uint)fVar1) {
              fVar16 = (float)-((int)fVar14 - (int)fVar1);
            }
          }
        }
        else {
          fVar16 = ABS(fVar14);
        }
        if ((uint)fVar16 <= (uint)fVar12) break;
        iVar10 = iVar10 + 1;
        if (iVar7 < iVar10) goto LAB_008401fe;
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != uVar5);
  }
  return true;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const bool				hasSignedZero	= supportsSignedZero(precision);
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		if (precision == glu::PRECISION_HIGHP || precision == glu::PRECISION_MEDIUMP)
		{
			// Require exact rounding result.
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0			= ((const float*)inputs[0])[compNdx];
				const float		out0		= ((const float*)outputs[0])[compNdx];
				const float		ref			= roundEven(in0);

				const deUint32	ulpDiff		= hasSignedZero ? getUlpDiff(out0, ref) : getUlpDiffIgnoreZeroSign(out0, ref);

				if (ulpDiff > 0)
				{
					m_failMsg << "Expected [" << compNdx << "] = " << HexFloat(ref) << ", got ULP diff " << tcu::toHex(ulpDiff);
					return false;
				}
			}
		}
		else
		{
			const int		mantissaBits	= getMinMantissaBits(precision);
			const deUint32	maxUlpDiff		= getMaxUlpDiffFromBits(mantissaBits);	// ULP diff for rounded integer value.
			const float		eps				= getEpsFromBits(1.0f, mantissaBits);	// epsilon for rounding bounds

			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0			= ((const float*)inputs[0])[compNdx];
				const float		out0		= ((const float*)outputs[0])[compNdx];
				const int		minRes		= int(roundEven(in0-eps));
				const int		maxRes		= int(roundEven(in0+eps));
				bool			anyOk		= false;

				for (int roundedVal = minRes; roundedVal <= maxRes; roundedVal++)
				{
					const deUint32 ulpDiff = getUlpDiffIgnoreZeroSign(out0, float(roundedVal));

					if (ulpDiff <= maxUlpDiff)
					{
						anyOk = true;
						break;
					}
				}

				if (!anyOk)
				{
					m_failMsg << "Expected [" << compNdx << "] = [" << minRes << ", " << maxRes << "] with ULP threshold " << tcu::toHex(maxUlpDiff);
					return false;
				}
			}
		}

		return true;
	}